

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void test_bf(void)

{
  ptls_cipher_context_t *ppVar1;
  uint8_t decrypted [8];
  uint8_t encrypted [8];
  long local_38;
  long local_30;
  
  ppVar1 = ptls_cipher_new(&ptls_openssl_bfecb,1,"");
  (*ppVar1->do_transform)(ppVar1,&local_30,test_bf::plaintext,8);
  ptls_cipher_free(ppVar1);
  _ok((uint)(local_30 == 0x61d2144ce730c0e1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/openssl.c",100);
  ppVar1 = ptls_cipher_new(&ptls_openssl_bfecb,0,"");
  (*ppVar1->do_transform)(ppVar1,&local_38,"deadbeef",8);
  (*ppVar1->do_transform)(ppVar1,&local_38,&local_30,8);
  ptls_cipher_free(ppVar1);
  _ok((uint)(local_38 == 0x78dd98614597f94e),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/openssl.c",0x6b);
  return;
}

Assistant:

static void test_bf(void)
{
#if PTLS_OPENSSL_HAVE_BF
    /* vectors from http://www.herongyang.com/Blowfish/Perl-Crypt-Blowfish-Test-Vector-128-Bit-Key.html */
    static const uint8_t key[PTLS_BLOWFISH_KEY_SIZE] = {0},
                         plaintext[PTLS_BLOWFISH_BLOCK_SIZE] = {0x4e, 0xf9, 0x97, 0x45, 0x61, 0x98, 0xdd, 0x78},
                         expected[PTLS_BLOWFISH_BLOCK_SIZE] = {0xe1, 0xc0, 0x30, 0xe7, 0x4c, 0x14, 0xd2, 0x61};
    uint8_t encrypted[PTLS_BLOWFISH_BLOCK_SIZE], decrypted[PTLS_BLOWFISH_BLOCK_SIZE];

    /* encrypt */
    ptls_cipher_context_t *ctx = ptls_cipher_new(&ptls_openssl_bfecb, 1, key);
    ptls_cipher_encrypt(ctx, encrypted, plaintext, PTLS_BLOWFISH_BLOCK_SIZE);
    ptls_cipher_free(ctx);
    ok(memcmp(encrypted, expected, PTLS_BLOWFISH_BLOCK_SIZE) == 0);

    /* decrypt */
    ctx = ptls_cipher_new(&ptls_openssl_bfecb, 0, key);
    ptls_cipher_encrypt(ctx, decrypted, "deadbeef", PTLS_BLOWFISH_BLOCK_SIZE);
    ptls_cipher_encrypt(ctx, decrypted, encrypted, PTLS_BLOWFISH_BLOCK_SIZE);
    ptls_cipher_free(ctx);
    ok(memcmp(decrypted, plaintext, PTLS_BLOWFISH_BLOCK_SIZE) == 0);
#endif
}